

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generators.c
# Opt level: O3

void take_gen(void *args0)

{
  int iVar1;
  _Bool _Var2;
  Value in_RAX;
  Value v;
  Value local_18;
  
  iVar1 = *(int *)((long)args0 + 8);
  *(int *)((long)args0 + 8) = iVar1 + -1;
  local_18 = in_RAX;
  while (((0 < iVar1 && (_Var2 = gen_should_finish(), !_Var2)) &&
         (_Var2 = gen_next(*args0,&local_18), _Var2))) {
    gen_yield((Value *)local_18.ptr);
    iVar1 = *(int *)((long)args0 + 8);
    *(int *)((long)args0 + 8) = iVar1 + -1;
  }
  gen_close(*args0);
  return;
}

Assistant:

static void
take_gen(void *args0)
{
    TakeGenArgs *args = (TakeGenArgs *) args0;
    while (args->n-- > 0 && !gen_should_finish()) {
        Value v;
        if (!gen_next(args->source, &v))
            break;
        gen_yield(&v);
    }
    gen_close(args->source);
}